

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O2

VRAnyCoreType __thiscall
MinVR::VRDataIndex::getValue(VRDataIndex *this,string *key,string *nameSpace,bool inherit)

{
  size_type sVar1;
  iterator iVar2;
  VRAnyCoreType VVar3;
  VRError *this_00;
  allocator<char> local_12f;
  allocator<char> local_12e;
  allocator<char> local_12d;
  int local_12c;
  string local_128;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)nameSpace);
  iVar2 = _getEntry(this,key,&local_48,inherit);
  std::__cxx11::string::~string((string *)&local_48);
  if ((_Rb_tree_header *)iVar2._M_node != &(this->_theIndex)._M_t._M_impl.super__Rb_tree_header) {
    VVar3.datum = (VRDatum_conflict *)(**(code **)(**(long **)(iVar2._M_node + 2) + 0x18))();
    return (VRAnyCoreType)VVar3.datum;
  }
  sVar1 = nameSpace->_M_string_length;
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  if (sVar1 == 0) {
    std::operator+(&local_c8,"Never heard of ",key);
    std::operator+(&local_a8,&local_c8,".");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"",(allocator<char> *)&local_68);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.h"
               ,(allocator<char> *)&local_12c);
    local_88._M_dataplus._M_p._0_4_ = 0x27b;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,
               "VRAnyCoreType MinVR::VRDataIndex::getValue(const std::string &, const std::string, const bool) const"
               ,&local_12f);
    VRError::VRError(this_00,&local_a8,&local_e8,&local_108,(int *)&local_88,&local_128);
    __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
  }
  std::operator+(&local_108,"Never heard of ",key);
  std::operator+(&local_e8,&local_108," in namespace ");
  std::operator+(&local_c8,&local_e8,nameSpace);
  std::operator+(&local_a8,&local_c8,".");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"",&local_12f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.h"
             ,&local_12d);
  local_12c = 0x27d;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,
             "VRAnyCoreType MinVR::VRDataIndex::getValue(const std::string &, const std::string, const bool) const"
             ,&local_12e);
  VRError::VRError(this_00,&local_a8,&local_128,&local_88,&local_12c,&local_68);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

VRAnyCoreType getValue(const std::string &key,
                         const std::string nameSpace = "",
                         const bool inherit = true) const {
    VRDataMap::iterator p =
      const_cast<VRDataIndex*>(this)->_getEntry(key, nameSpace, inherit);

    if (p == _theIndex.end()) {
      if (nameSpace.empty()) {
        VRERRORNOADV("Never heard of " + key + ".");
      } else {
        VRERRORNOADV("Never heard of " + key + " in namespace " + nameSpace + ".");
      }
    } else {
      return p->second->getValue();
    }
  }